

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_SetTransportParamsInCallback_Test::TestBody
          (QUICMethodTest_SetTransportParamsInCallback_Test *this)

{
  internal iVar1;
  int iVar2;
  size_t in_RCX;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_1;
  Span<const_unsigned_char> expected;
  Span<const_unsigned_char> expected_00;
  AssertionResult gtest_ar_;
  uint8_t kClientParams [4];
  SSL_QUIC_METHOD quic_method;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  AssertHelper local_80;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string local_68;
  undefined1 local_44 [12];
  code *local_38;
  code *local_30;
  code *local_28;
  code *local_20;
  
  local_44._4_8_ = QUICMethodTest::SetReadSecretCallback;
  local_38 = QUICMethodTest::SetWriteSecretCallback;
  local_30 = QUICMethodTest::AddHandshakeDataCallback;
  local_28 = QUICMethodTest::FlushFlightCallback;
  local_20 = QUICMethodTest::SendAlertCallback;
  iVar2 = SSL_CTX_set_quic_method
                    ((this->super_QUICMethodTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     (SSL_QUIC_METHOD *)(local_44 + 4));
  local_78[0] = (internal)(iVar2 != 0);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar2 == 0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,local_78,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1f3c,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
  }
  else {
    iVar2 = SSL_CTX_set_quic_method
                      ((this->super_QUICMethodTest).server_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                       (SSL_QUIC_METHOD *)(local_44 + 4));
    local_78[0] = (internal)(iVar2 != 0);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_68,local_78,
                 (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1f3d,local_68._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    }
    else {
      iVar1 = (internal)QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_78[0] = iVar1;
      if (!(bool)iVar1) {
        testing::Message::Message((Message *)&local_88);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_68,local_78,(AssertionResult *)"CreateClientAndServer()","false","true",
                   in_R9);
        in_RCX = 7999;
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,7999,local_68._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if (local_88._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_88._M_head_impl + 8))();
        }
        if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_70,local_70);
        }
        if (!(bool)iVar1) {
          return;
        }
      }
      local_44._0_4_ = 0x4030201;
      iVar2 = SSL_set_quic_transport_params
                        ((this->super_QUICMethodTest).client_._M_t.
                         super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,local_44,4);
      local_78[0] = (internal)(iVar2 != 0);
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_78[0]) {
        SSL_CTX_set_tlsext_servername_callback
                  ((this->super_QUICMethodTest).server_ctx_._M_t.
                   super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                   TestBody::anon_class_1_0_00000001::__invoke);
        iVar1 = (internal)
                QUICMethodTest::RunQUICHandshakesAndExpectError
                          (&this->super_QUICMethodTest,kNoError);
        local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_78[0] = iVar1;
        if (!(bool)iVar1) {
          testing::Message::Message((Message *)&local_88);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_68,local_78,(AssertionResult *)"CompleteHandshakesForQUIC()","false",
                     "true",in_R9);
          in_RCX = 0x1f4b;
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1f4b,local_68._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          if (local_88._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_88._M_head_impl + 8))();
          }
          if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_70,local_70);
          }
          if (!(bool)iVar1) {
            return;
          }
        }
        expected.size_ = in_RCX;
        expected.data_ = (uchar *)0x3;
        ExpectReceivedTransportParamsEqual
                  ((anon_unknown_0 *)
                   (this->super_QUICMethodTest).client_._M_t.
                   super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                   (SSL *)TestBody::kServerParams,expected);
        expected_00.size_ = in_RCX;
        expected_00.data_ = &DAT_00000004;
        ExpectReceivedTransportParamsEqual
                  ((anon_unknown_0 *)
                   (this->super_QUICMethodTest).server_._M_t.
                   super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(SSL *)local_44,expected_00);
        return;
      }
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_68,local_78,
                 (AssertionResult *)
                 "SSL_set_quic_transport_params(client_.get(), kClientParams, sizeof(kClientParams))"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1f43,local_68._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_88._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_88._M_head_impl + 8))();
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  return;
}

Assistant:

TEST_F(QUICMethodTest, SetTransportParamsInCallback) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  ASSERT_TRUE(CreateClientAndServer());
  uint8_t kClientParams[] = {1, 2, 3, 4};
  static uint8_t kServerParams[] = {5, 6, 7};
  ASSERT_TRUE(SSL_set_quic_transport_params(client_.get(), kClientParams,
                                            sizeof(kClientParams)));
  SSL_CTX_set_tlsext_servername_callback(
      server_ctx_.get(), [](SSL *ssl, int *out_alert, void *arg) -> int {
        EXPECT_TRUE(SSL_set_quic_transport_params(ssl, kServerParams,
                                                  sizeof(kServerParams)));
        return SSL_TLSEXT_ERR_OK;
      });

  ASSERT_TRUE(CompleteHandshakesForQUIC());
  ExpectReceivedTransportParamsEqual(client_.get(), kServerParams);
  ExpectReceivedTransportParamsEqual(server_.get(), kClientParams);
}